

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<144>,unsigned_int>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<144> *k,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  uint h;
  
  while (start < 0x90) {
    flipbit(k,0x12,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0x12,0,&h);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(hashes,&h);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<144>,unsigned_int>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0x12,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}